

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O0

void __thiscall
checkqueue_tests::test_CheckQueue_FrozenCleanup::test_method(test_CheckQueue_FrozenCleanup *this)

{
  long in_FS_OFFSET;
  int x;
  bool fails;
  thread t0;
  __single_object queue;
  unique_lock<std::mutex> l_1;
  unique_lock<std::mutex> l;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  __int_type_conflict in_stack_ffffffffffffff00;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffff08;
  undefined6 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff16;
  byte bVar1;
  type *__f;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  int iVar2;
  unit_test_log_t *in_stack_ffffffffffffff28;
  bool local_c1;
  const_string local_b8 [2];
  lazy_ostream local_98 [2];
  assertion_result local_78 [2];
  type *local_40;
  type local_30 [3];
  undefined1 local_18 [16];
  long lVar3;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  __f = local_30;
  std::make_unique<CCheckQueue<FrozenCleanupCheck>,unsigned_int_const&,int_const&>
            ((uint *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),(int *)__f);
  local_c1 = false;
  local_40 = __f;
  std::thread::thread<checkqueue_tests::test_CheckQueue_FrozenCleanup::test_method()::__0,,void>
            ((thread *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),__f);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
             (mutex_type *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  std::condition_variable::wait<checkqueue_tests::test_CheckQueue_FrozenCleanup::test_method()::__1>
            ((condition_variable *)FrozenCleanupCheck::cv,local_18);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffee8);
  iVar2 = 0;
  while( true ) {
    bVar1 = 0;
    if (iVar2 < 100) {
      bVar1 = local_c1 ^ 0xff;
    }
    if ((bVar1 & 1) == 0) break;
    std::
    unique_ptr<CCheckQueue<FrozenCleanupCheck>,_std::default_delete<CCheckQueue<FrozenCleanupCheck>_>_>
    ::operator->((unique_ptr<CCheckQueue<FrozenCleanupCheck>,_std::default_delete<CCheckQueue<FrozenCleanupCheck>_>_>
                  *)in_stack_fffffffffffffee8);
    in_stack_ffffffffffffff16 =
         AnnotatedMixin<std::mutex>::try_lock
                   ((AnnotatedMixin<std::mutex> *)in_stack_fffffffffffffee8);
    iVar2 = iVar2 + 1;
    local_c1 = (bool)in_stack_ffffffffffffff16;
  }
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)
             CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
             (mutex_type *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
  std::__atomic_base<unsigned_long>::operator=(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffee8);
  std::condition_variable::notify_one();
  std::thread::join();
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
               (pointer)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               (unsigned_long)in_stack_fffffffffffffee8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffee8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffff28,(const_string *)CONCAT44(iVar2,in_stack_ffffffffffffff20),
               (size_t)__f,
               (const_string *)
               CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
               (bool)in_stack_fffffffffffffef7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
               (pointer)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               (unsigned_long)in_stack_fffffffffffffee8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               (basic_cstring<const_char> *)in_stack_fffffffffffffee8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8),
               (pointer)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               (unsigned_long)in_stack_fffffffffffffee8);
    in_stack_fffffffffffffee8 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_78,local_98,local_b8,0x161,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffee8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffee8);
    in_stack_fffffffffffffeff = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffeff);
  std::thread::~thread((thread *)in_stack_fffffffffffffee8);
  std::
  unique_ptr<CCheckQueue<FrozenCleanupCheck>,_std::default_delete<CCheckQueue<FrozenCleanupCheck>_>_>
  ::~unique_ptr((unique_ptr<CCheckQueue<FrozenCleanupCheck>,_std::default_delete<CCheckQueue<FrozenCleanupCheck>_>_>
                 *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CheckQueue_FrozenCleanup)
{
    auto queue = std::make_unique<FrozenCleanup_Queue>(QUEUE_BATCH_SIZE, SCRIPT_CHECK_THREADS);
    bool fails = false;
    std::thread t0([&]() {
        CCheckQueueControl<FrozenCleanupCheck> control(queue.get());
        std::vector<FrozenCleanupCheck> vChecks(1);
        control.Add(std::move(vChecks));
        bool waitResult = control.Wait(); // Hangs here
        assert(waitResult);
    });
    {
        std::unique_lock<std::mutex> l(FrozenCleanupCheck::m);
        // Wait until the queue has finished all jobs and frozen
        FrozenCleanupCheck::cv.wait(l, [](){return FrozenCleanupCheck::nFrozen == 1;});
    }
    // Try to get control of the queue a bunch of times
    for (auto x = 0; x < 100 && !fails; ++x) {
        fails = queue->m_control_mutex.try_lock();
    }
    {
        // Unfreeze (we need lock n case of spurious wakeup)
        std::unique_lock<std::mutex> l(FrozenCleanupCheck::m);
        FrozenCleanupCheck::nFrozen = 0;
    }
    // Awaken frozen destructor
    FrozenCleanupCheck::cv.notify_one();
    // Wait for control to finish
    t0.join();
    BOOST_REQUIRE(!fails);
}